

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_direct.cpp
# Opt level: O3

void __thiscall
direct_solvers_lower_upper_factorisation_initialise_Test::
~direct_solvers_lower_upper_factorisation_initialise_Test
          (direct_solvers_lower_upper_factorisation_initialise_Test *this)

{
  pointer puVar1;
  
  (this->super_direct_solvers).super_Test._vptr_Test = (_func_int **)&PTR__direct_solvers_00156b80;
  puVar1 = (this->super_direct_solvers).lup_solver.pivots.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_direct_solvers).lup_solver.pivots.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&(this->super_direct_solvers).lup_solver.lu_factorised.
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         );
  puVar1 = (this->super_direct_solvers).lu_solver.pivots.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_direct_solvers).lu_solver.pivots.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&(this->super_direct_solvers).lu_solver.lu_factorised.
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         );
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x90);
  return;
}

Assistant:

TEST_F(direct_solvers, lower_upper_factorisation_initialise) {

  Solver_Config data;
  data.type = Solver_Type::lower_upper_factorisation;
  data.factor_tolerance = 5.0;
  data.pivot = false;

  lu_solver.initialise(data);
  auto lu_data = lu_solver.get_config();
  EXPECT_EQ(lu_data.type, Solver_Type::lower_upper_factorisation);
  EXPECT_EQ(lu_data.pivot, false);
  EXPECT_EQ(lu_data.factor_tolerance, data.factor_tolerance);

  data.pivot = true;
  lup_solver.initialise(data);
  auto lup_data = lup_solver.get_config();
  EXPECT_EQ(lup_data.type, Solver_Type::lower_upper_factorisation);
  EXPECT_EQ(lup_data.pivot, true);
  EXPECT_EQ(lup_data.factor_tolerance, data.factor_tolerance);
}